

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_TEXM3X2TEX(Context *ctx)

{
  char local_358 [8];
  char code [512];
  char sampler [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  DestArgInfo *info;
  Context *ctx_local;
  
  if (ctx->texm3x2pad_src0 != -1) {
    get_GLSL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,code + 0x1f8,0x40);
    get_GLSL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_src0,src1 + 0x38,0x40);
    get_GLSL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_dst0,src2 + 0x38,0x40);
    get_GLSL_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,sampler + 0x38,0x40);
    get_GLSL_destarg_varname(ctx,src0 + 0x38,0x40);
    make_GLSL_destarg_assign
              (ctx,local_358,0x200,"texture2D(%s, vec2(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)))",
               code + 0x1f8,src1 + 0x38,src2 + 0x38,sampler + 0x38,src0 + 0x38);
    output_line(ctx,"%s",local_358);
  }
  return;
}

Assistant:

static void emit_GLSL_TEXM3X2TEX(Context *ctx)
{
    if (ctx->texm3x2pad_src0 == -1)
        return;

    DestArgInfo *info = &ctx->dest_arg;
    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char sampler[64];
    char code[512];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_src0,
                            src0, sizeof (src0));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_dst0,
                            src1, sizeof (src1));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src2, sizeof (src2));
    get_GLSL_destarg_varname(ctx, dst, sizeof (dst));

    make_GLSL_destarg_assign(ctx, code, sizeof (code),
        "texture2D(%s, vec2(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)))",
        sampler, src0, src1, src2, dst);

    output_line(ctx, "%s", code);
}